

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

int Mf_CutAreaDerefed2(Mf_Man_t *p,int *pCut)

{
  int iVar1;
  int iVar2;
  int local_24;
  int i;
  int iObj;
  int Ela1;
  int *pCut_local;
  Mf_Man_t *p_local;
  
  Vec_IntClear(&p->vTemp);
  iVar1 = Mf_CutRef2_rec(p,pCut,&p->vTemp,8);
  for (local_24 = 0; iVar2 = Vec_IntSize(&p->vTemp), local_24 < iVar2; local_24 = local_24 + 1) {
    iVar2 = Vec_IntEntry(&p->vTemp,local_24);
    Mf_ObjMapRefDec(p,iVar2);
  }
  return iVar1;
}

Assistant:

static inline int Mf_CutAreaDerefed2( Mf_Man_t * p, int * pCut )
{
    int Ela1, iObj, i;
    Vec_IntClear( &p->vTemp );
    Ela1 = Mf_CutRef2_rec( p, pCut, &p->vTemp, 8 );
    Vec_IntForEachEntry( &p->vTemp, iObj, i )
        Mf_ObjMapRefDec( p, iObj );
    return Ela1;
}